

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3_loader.h
# Opt level: O1

void close_libgl(void)

{
  if (libgl != (void *)0x0) {
    dlclose();
    libgl = (void *)0x0;
  }
  if (libegl != (void *)0x0) {
    dlclose();
    libegl = (void *)0x0;
  }
  if (libglx != (void *)0x0) {
    dlclose();
    libglx = (void *)0x0;
  }
  return;
}

Assistant:

static void close_libgl(void)
{
    if (libgl) {
        dlclose(libgl);
        libgl = NULL;
    }
    if (libegl) {
        dlclose(libegl);
        libegl = NULL;
    }
    if (libglx) {
        dlclose(libglx);
        libglx = NULL;
    }
}